

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O0

int writeMPS_dense(char *filename,int *numRow,int *numCol,int *objSense,double *objOffset,
                  vector<double,_std::allocator<double>_> *A_cw,
                  vector<double,_std::allocator<double>_> *rhs,
                  vector<double,_std::allocator<double>_> *cost,
                  vector<double,_std::allocator<double>_> *lb,
                  vector<double,_std::allocator<double>_> *ub,
                  vector<int,_std::allocator<int>_> *integerColumn)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  uint *in_RCX;
  uint *in_RDX;
  vector<int,_std::allocator<int>_> *unaff_RBX;
  uint *in_RSI;
  undefined8 *in_R8;
  vector<double,_std::allocator<double>_> *in_R9;
  double *unaff_R14;
  int *unaff_retaddr;
  int *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  char *in_stack_00000018;
  vector<int,_std::allocator<int>_> *in_stack_00000030;
  vector<double,_std::allocator<double>_> *in_stack_00000038;
  vector<double,_std::allocator<double>_> *in_stack_00000040;
  vector<double,_std::allocator<double>_> *in_stack_00000048;
  vector<double,_std::allocator<double>_> *in_stack_00000050;
  int rtCd;
  double r_v_1;
  int r_n_1;
  int el_n;
  int c_n_1;
  double r_v;
  int r_n;
  int c_n;
  int numNz;
  vector<double,_std::allocator<double>_> Avalue;
  vector<int,_std::allocator<int>_> Aindex;
  vector<int,_std::allocator<int>_> Astart;
  size_type in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff10;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_94;
  int local_90;
  uint local_8c;
  vector<double,_std::allocator<double>_> local_88;
  vector<int,_std::allocator<int>_> local_70;
  vector<int,_std::allocator<int>_> local_58;
  vector<double,_std::allocator<double>_> *local_40;
  undefined8 *local_38;
  uint *local_30;
  uint *local_28;
  uint *local_20;
  
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  printf("writeMPS_dense: Model has %d rows and %d columns\n",(ulong)*in_RSI,(ulong)*in_RDX);
  printf("writeMPS_dense: Objective sense is %d; Objective offset is %g\n",*local_38,
         (ulong)*local_30);
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c8018);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c8025);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c8032);
  local_8c = 0;
  for (local_90 = 0; local_90 < (int)*local_28; local_90 = local_90 + 1) {
    for (local_94 = 0; local_94 < (int)*local_20; local_94 = local_94 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_40,(long)(int)(local_94 + local_90 * *local_20));
      if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
        local_8c = local_8c + 1;
      }
    }
  }
  printf("Model has %d nonzeros\n",(ulong)local_8c);
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,0);
  *pvVar4 = 0;
  for (local_b0 = 0; local_b0 < (int)*local_28; local_b0 = local_b0 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)local_b0);
    local_b4 = *pvVar4;
    for (local_b8 = 0; local_b8 < (int)*local_20; local_b8 = local_b8 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_40,(long)(int)(local_b8 + local_b0 * *local_20));
      dVar1 = *pvVar3;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_b4);
        *pvVar4 = local_b8;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_88,(long)local_b4);
        *pvVar3 = dVar1;
        local_b4 = local_b4 + 1;
      }
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_58,(long)(local_b0 + 1));
    *pvVar4 = local_b4;
  }
  printf("writeMPS_dense: calling writeMPS_sparse\n");
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  iVar2 = writeMPS_sparse(in_stack_00000018,(int *)in_stack_00000010,in_stack_00000008,unaff_retaddr
                          ,unaff_R14,unaff_RBX,in_stack_00000030,in_stack_00000038,in_stack_00000040
                          ,in_stack_00000048,in_stack_00000050,
                          (vector<double,_std::allocator<double>_> *)r_v_1,_r_n_1);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_00000010);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_00000010);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_00000010);
  return iVar2;
}

Assistant:

int writeMPS_dense(const char *filename, int& numRow, int& numCol, int& objSense, double& objOffset,
		   vector<double>& A_cw,
		   vector<double>& rhs, vector<double>& cost, vector<double>& lb, vector<double>& ub,
		   vector<int>& integerColumn) {
#ifdef JAJH_dev
  printf("writeMPS_dense: Model has %d rows and %d columns\n", numRow, numCol);
  printf("writeMPS_dense: Objective sense is %d; Objective offset is %g\n", objSense, objOffset);
  cout<<flush;
#endif
  
  vector<int> Astart;
  vector<int> Aindex;
  vector<double> Avalue;
  int numNz = 0;
  for (int c_n = 0; c_n<numCol; c_n++) {
    for (int r_n = 0; r_n<numRow; r_n++) {
      double r_v = A_cw[r_n+c_n*numRow];
      if (r_v != 0) numNz++;
    }
  }
  printf("Model has %d nonzeros\n", numNz);cout<<flush;
  Astart.resize(numCol+1);
  Aindex.resize(numNz);
  Avalue.resize(numNz);
  Astart[0] = 0;
  for (int c_n = 0; c_n<numCol; c_n++) {
    int el_n = Astart[c_n];
    for (int r_n = 0; r_n<numRow; r_n++) {
      double r_v = A_cw[r_n+c_n*numRow];
      if (r_v != 0) {
  	Aindex[el_n] = r_n;
  	Avalue[el_n] = r_v;
  	el_n++;
      }
    }
    Astart[c_n+1] = el_n;
  }
  printf("writeMPS_dense: calling writeMPS_sparse\n"); cout<<flush;
  int rtCd = writeMPS_sparse(filename, numRow, numCol, objSense, objOffset,
			    Astart, Aindex, Avalue,
			    rhs, cost, lb, ub,
			    integerColumn);
  return rtCd;
}